

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  pointer pcVar2;
  cmSourceFile *source;
  bool bVar3;
  string *psVar4;
  mapped_type *this_01;
  pointer puVar5;
  pointer ppcVar6;
  pointer puVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  bool hasSourceExtension;
  string objectName;
  string dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_148;
  pointer local_130;
  bool local_128;
  undefined7 uStack_127;
  undefined8 local_120;
  long local_118 [2];
  string local_108;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  string local_c8;
  pointer local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_90;
  pointer local_88;
  string local_80;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  puVar5 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar7) {
    local_98 = puVar7;
    local_90 = localObjectFiles;
    do {
      bVar3 = cmGeneratorTarget::CanCompileSources
                        ((puVar5->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar3) {
        local_148.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (puVar5->_M_t).
                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
        GetConfigName_abi_cxx11_(&local_108,this);
        cmGeneratorTarget::GetObjectSources(this_00,&local_148,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          (ulong)(local_108.field_2._M_allocated_capacity + 1));
        }
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           (((puVar5->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                            LocalGenerator);
        pcVar1 = (psVar4->_M_dataplus)._M_p;
        pcVar2 = (pointer)psVar4->_M_string_length;
        local_60._M_head_impl = (cmGeneratorTarget *)0x1;
        puStack_58 = local_50;
        local_50[0] = 0x2f;
        local_130 = puVar5;
        (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
                  (&local_128,this,
                   (puVar5->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        local_108.field_2._M_allocated_capacity = (size_type)local_60._M_head_impl;
        local_108.field_2._8_8_ = puStack_58;
        local_e0 = CONCAT71(uStack_127,local_128);
        local_e8 = local_120;
        local_c8._M_dataplus._M_p = (pointer)0x1;
        local_d0 = &local_c8.field_2;
        local_c8.field_2._M_local_buf[0] = '/';
        local_d8 = 1;
        views._M_len = 4;
        views._M_array = (iterator)&local_108;
        local_108._M_dataplus._M_p = pcVar2;
        local_108._M_string_length = (size_type)pcVar1;
        local_c8._M_string_length = (size_type)local_d0;
        cmCatViews_abi_cxx11_(&local_80,views);
        if ((long *)CONCAT71(uStack_127,local_128) != local_118) {
          operator_delete((long *)CONCAT71(uStack_127,local_128),local_118[0] + 1);
        }
        local_88 = local_148.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        ppcVar6 = local_148.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_148.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_148.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            source = *ppcVar6;
            local_128 = true;
            cmLocalGenerator::GetObjectFileNameWithoutTarget
                      (&local_108,(cmLocalGenerator *)this,source,&local_80,&local_128,(char *)0x0);
            bVar3 = cmsys::SystemTools::FileIsFullPath(&local_108);
            if (bVar3) {
              cmsys::SystemTools::GetFilenameName(&local_c8,&local_108);
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,
                                CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                         local_c8.field_2._M_local_buf[0]) + 1);
              }
            }
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                      ::operator[](local_90,&local_108);
            this_01->HasSourceExtension = local_128;
            local_60._M_head_impl =
                 (local_130->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            cmSourceFile::GetLanguage_abi_cxx11_(&local_c8,source);
            std::
            vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
            ::emplace_back<cmGeneratorTarget*,std::__cxx11::string>
                      ((vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
                        *)this_01,&local_60._M_head_impl,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                       local_c8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,
                              (ulong)(local_108.field_2._M_allocated_capacity + 1));
            }
            ppcVar6 = ppcVar6 + 1;
          } while (ppcVar6 != local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        puVar7 = local_98;
        puVar5 = local_130;
        if (local_148.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar7);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetLocalObjectFiles(
  std::map<std::string, LocalObjectInfo>& localObjectFiles)
{
  for (const auto& gt : this->GetGeneratorTargets()) {
    if (!gt->CanCompileSources()) {
      continue;
    }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->GetConfigName());
    // Compute full path to object file directory for this target.
    std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                               '/', this->GetTargetDirectory(gt.get()), '/');
    // Compute the name of each object file.
    for (cmSourceFile const* sf : objectSources) {
      bool hasSourceExtension = true;
      std::string objectName =
        this->GetObjectFileNameWithoutTarget(*sf, dir, &hasSourceExtension);
      if (cmSystemTools::FileIsFullPath(objectName)) {
        objectName = cmSystemTools::GetFilenameName(objectName);
      }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.emplace_back(gt.get(), sf->GetLanguage());
    }
  }
}